

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O0

void __thiscall
implementations::brainfck::BFImplementation::BFImplementation(BFImplementation *this,env_p *_env)

{
  shared_ptr<implementations::brainfck::BFEnvironment> local_48 [2];
  shared_ptr<implementations::brainfck::BFEnvironment> local_28;
  env_p *local_18;
  env_p *_env_local;
  BFImplementation *this_local;
  
  local_18 = _env;
  _env_local = (env_p *)this;
  std::shared_ptr<implementations::brainfck::BFEnvironment>::shared_ptr(&local_28,_env);
  stackless::
  Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>::
  Implementation(&this->
                  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
                 ,&local_28);
  std::shared_ptr<implementations::brainfck::BFEnvironment>::~shared_ptr(&local_28);
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR_getCurrentFrame_00175978;
  std::shared_ptr<implementations::brainfck::BFEnvironment>::shared_ptr(local_48,_env);
  BFFrame::BFFrame(&this->frame,local_48);
  std::shared_ptr<implementations::brainfck::BFEnvironment>::~shared_ptr(local_48);
  return;
}

Assistant:

BFImplementation(env_p _env) : Implementation(_env), frame(BFFrame(_env)) {
	}